

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

pair<bool,_bool> __thiscall
hanabi_learning_env::HanabiState::AddToFireworks(HanabiState *this,HanabiCard card)

{
  pointer piVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  
  bVar2 = CardPlayableOnFireworks(this,card);
  if (bVar2) {
    piVar1 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar1[card.color_] + 1;
    piVar1[card.color_] = iVar5;
    uVar3 = 1;
    uVar4 = 1;
    if ((iVar5 == this->parent_game_->num_ranks_) &&
       (this->information_tokens_ < this->parent_game_->max_information_tokens_)) {
      this->information_tokens_ = this->information_tokens_ + 1;
      uVar4 = 0x100;
      goto LAB_001194bc;
    }
  }
  else {
    DecrementLifeTokens(this);
    uVar4 = 0;
  }
  uVar3 = uVar4;
  uVar4 = 0;
LAB_001194bc:
  return (pair<bool,_bool>)(uVar4 | uVar3);
}

Assistant:

std::pair<bool, bool> HanabiState::AddToFireworks(HanabiCard card) {
  if (CardPlayableOnFireworks(card)) {
    ++fireworks_[card.Color()];
    // Check if player completed a stack.
    if (fireworks_[card.Color()] == ParentGame()->NumRanks()) {
      return {true, IncrementInformationTokens()};
    }
    return {true, false};
  } else {
    DecrementLifeTokens();
    return {false, false};
  }
}